

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeGenericAlias * __thiscall
ExpressionContext::GetGenericAliasType(ExpressionContext *this,SynIdentifier *baseName)

{
  uint uVar1;
  TypeGenericAlias *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  InplaceStr name;
  TypeGenericAlias *local_40;
  TypeGenericAlias *result;
  
  uVar1 = (this->genericAliasTypes).count;
  uVar5 = 0;
  while( true ) {
    if (uVar1 == uVar5) {
      iVar4 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x68);
      name = GetGenericAliasTypeName(this,baseName->name);
      TypeGenericAlias::TypeGenericAlias
                ((TypeGenericAlias *)CONCAT44(extraout_var,iVar4),name,baseName);
      result = (TypeGenericAlias *)CONCAT44(extraout_var,iVar4);
      SmallArray<TypeGenericAlias_*,_128U>::push_back(&this->genericAliasTypes,&result);
      local_40 = result;
      SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&local_40);
      return result;
    }
    pTVar2 = (this->genericAliasTypes).data[uVar5];
    if ((pTVar2 != (TypeGenericAlias *)0x0) &&
       (bVar3 = InplaceStr::operator==(&pTVar2->baseName->name,&baseName->name), bVar3)) break;
    uVar5 = uVar5 + 1;
  }
  return pTVar2;
}

Assistant:

TypeGenericAlias* ExpressionContext::GetGenericAliasType(SynIdentifier *baseName)
{
	for(unsigned i = 0, e = genericAliasTypes.count; i < e; i++)
	{
		if(TypeGenericAlias *type = genericAliasTypes.data[i])
		{
			if(type->baseName->name == baseName->name)
				return type;
		}
	}

	// Create new type
	TypeGenericAlias* result = new (get<TypeGenericAlias>()) TypeGenericAlias(GetGenericAliasTypeName(*this, baseName->name), baseName);

	genericAliasTypes.push_back(result);
	types.push_back(result);

	return result;
}